

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

idx_t duckdb::TemplatedUpdateNumericStatistics<unsigned_int>
                (UpdateSegment *segment,SegmentStatistics *stats,UnifiedVectorFormat *update,
                idx_t count,SelectionVector *sel)

{
  uint uVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  idx_t iVar6;
  idx_t iVar7;
  uint uVar8;
  idx_t iVar9;
  uint uVar10;
  
  pdVar2 = update->data;
  if ((update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      psVar4 = update->sel->sel_vector;
      uVar8 = *(uint *)((long)&(stats->statistics).stats_union + 8);
      uVar10 = *(uint *)((long)&(stats->statistics).stats_union + 0x18);
      iVar6 = 0;
      do {
        iVar7 = iVar6;
        if (psVar4 != (sel_t *)0x0) {
          iVar7 = (idx_t)psVar4[iVar6];
        }
        uVar1 = *(uint *)(pdVar2 + iVar7 * 4);
        if (uVar1 <= uVar8) {
          uVar8 = uVar1;
        }
        if (uVar10 <= uVar1) {
          uVar10 = uVar1;
        }
        *(uint *)((long)&(stats->statistics).stats_union + 8) = uVar8;
        *(uint *)((long)&(stats->statistics).stats_union + 0x18) = uVar10;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
    this = (sel->selection_data).internal.
           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (sel->selection_data).internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (sel->selection_data).internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    sel->sel_vector = (sel_t *)0x0;
    iVar6 = count;
  }
  else {
    SelectionVector::Initialize(sel,0x800);
    if (count == 0) {
      iVar6 = 0;
    }
    else {
      puVar3 = (update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      psVar4 = update->sel->sel_vector;
      psVar5 = sel->sel_vector;
      iVar7 = 0;
      iVar6 = 0;
      do {
        iVar9 = iVar7;
        if (psVar4 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar4[iVar7];
        }
        if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[iVar9 >> 6] >> (iVar9 & 0x3f) & 1) != 0)) {
          psVar5[iVar6] = (sel_t)iVar7;
          iVar6 = iVar6 + 1;
          uVar8 = *(uint *)(pdVar2 + iVar9 * 4);
          uVar10 = *(uint *)((long)&(stats->statistics).stats_union + 8);
          uVar1 = *(uint *)((long)&(stats->statistics).stats_union + 0x18);
          if (uVar8 <= uVar10) {
            uVar10 = uVar8;
          }
          *(uint *)((long)&(stats->statistics).stats_union + 8) = uVar10;
          if (uVar8 < uVar1) {
            uVar8 = uVar1;
          }
          *(uint *)((long)&(stats->statistics).stats_union + 0x18) = uVar8;
        }
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
  }
  return iVar6;
}

Assistant:

idx_t TemplatedUpdateNumericStatistics(UpdateSegment *segment, SegmentStatistics &stats, UnifiedVectorFormat &update,
                                       idx_t count, SelectionVector &sel) {
	auto update_data = update.GetData<T>(update);
	auto &mask = update.validity;

	if (mask.AllValid()) {
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			stats.statistics.UpdateNumericStats<T>(update_data[idx]);
		}
		sel.Initialize(nullptr);
		return count;
	} else {
		idx_t not_null_count = 0;
		sel.Initialize(STANDARD_VECTOR_SIZE);
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			if (mask.RowIsValid(idx)) {
				sel.set_index(not_null_count++, i);
				stats.statistics.UpdateNumericStats<T>(update_data[idx]);
			}
		}
		return not_null_count;
	}
}